

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  undefined8 this_00;
  bool bVar1;
  uint32_t *puVar2;
  Arena *arena;
  LogMessage *pLVar3;
  string *psVar4;
  SourceCodeInfo *other;
  ErrorMaker local_110;
  string_view local_100;
  LogMessage local_e8 [19];
  Voidify local_d5;
  int local_d4;
  string_view local_d0;
  string_view local_c0;
  undefined1 local_b0 [8];
  LocationRecorder root_location;
  undefined1 local_88 [8];
  SourceCodeInfo source_code_info;
  FileDescriptorProto *file_local;
  Tokenizer *input_local;
  Parser *this_local;
  
  this->input_ = input;
  this->had_errors_ = false;
  source_code_info.field_0._48_8_ = file;
  std::__cxx11::string::clear();
  SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)local_88);
  this->source_code_info_ = (SourceCodeInfo *)local_88;
  bVar1 = LookingAtType(this,TYPE_START);
  if (bVar1) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
               &this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder((LocationRecorder *)local_b0,this);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)local_b0,(Message *)source_code_info.field_0._48_8_,OTHER);
  if ((this->require_syntax_identifier_ & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"syntax");
    bVar1 = LookingAt(this,local_c0);
    if (bVar1) goto LAB_001fde8e;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"edition");
    bVar1 = LookingAt(this,local_d0);
    if (bVar1) goto LAB_001fde8e;
    if ((this->stop_after_syntax_identifier_ & 1U) == 0) {
      absl::lts_20240722::log_internal::LogMessage::LogMessage
                (local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/parser.cc"
                 ,0x2ae);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream(local_e8);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [41])"No syntax specified for the proto file: ");
      psVar4 = FileDescriptorProto::name_abi_cxx11_
                         ((FileDescriptorProto *)source_code_info.field_0._48_8_);
      pLVar3 = (LogMessage *)
               absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar3,(string *)psVar4);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [35])". Please use \'syntax = \"proto2\";\' ");
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [45])"or \'syntax = \"proto3\";\' to specify a syntax ");
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [39])"version. (Defaulted to proto2 syntax.)");
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_d5,pLVar3);
      absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_e8);
      std::__cxx11::string::operator=((string *)&this->syntax_identifier_,"proto2");
    }
  }
  else {
LAB_001fde8e:
    bVar1 = ParseSyntaxIdentifier
                      (this,(FileDescriptorProto *)source_code_info.field_0._48_8_,
                       (LocationRecorder *)local_b0);
    this_00 = source_code_info.field_0._48_8_;
    if (!bVar1) {
      this_local._7_1_ = 0;
      local_d4 = 1;
      goto LAB_001fe232;
    }
    if (source_code_info.field_0._48_8_ != 0) {
      puVar2 = internal::HasBits<1>::operator[]
                         ((HasBits<1> *)(source_code_info.field_0._48_8_ + 0x10),0);
      *(byte *)puVar2 = (byte)*puVar2 | 4;
      arena = MessageLite::GetArena((MessageLite *)this_00);
      internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)(this_00 + 0xc0),&this->syntax_identifier_,arena);
      bVar1 = std::operator==(&this->syntax_identifier_,"editions");
      if (bVar1) {
        FileDescriptorProto::set_edition
                  ((FileDescriptorProto *)source_code_info.field_0._48_8_,this->edition_);
      }
    }
  }
  if ((this->stop_after_syntax_identifier_ & 1U) == 0) {
    while (bVar1 = AtEnd(this), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = ParseTopLevelStatement
                        (this,(FileDescriptorProto *)source_code_info.field_0._48_8_,
                         (LocationRecorder *)local_b0);
      if (!bVar1) {
        SkipStatement(this);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100,"}");
        bVar1 = LookingAt(this,local_100);
        if (bVar1) {
          ErrorMaker::ErrorMaker(&local_110,"Unmatched \"}\".");
          RecordError(this,local_110);
          io::Tokenizer::NextWithComments
                    (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
                     &this->upcoming_doc_comments_);
        }
      }
    }
    local_d4 = 0;
  }
  else {
    this_local._7_1_ = (this->had_errors_ ^ 0xffU) & 1;
    local_d4 = 1;
  }
LAB_001fe232:
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_b0);
  if (local_d4 == 0) {
    this->input_ = (Tokenizer *)0x0;
    this->source_code_info_ = (SourceCodeInfo *)0x0;
    if (source_code_info.field_0._48_8_ == 0) {
      __assert_fail("file != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/parser.cc"
                    ,0x2ca,
                    "bool google::protobuf::compiler::Parser::Parse(io::Tokenizer *, FileDescriptorProto *)"
                   );
    }
    other = FileDescriptorProto::mutable_source_code_info
                      ((FileDescriptorProto *)source_code_info.field_0._48_8_);
    SourceCodeInfo::Swap((SourceCodeInfo *)local_88,other);
    this_local._7_1_ = (this->had_errors_ ^ 0xffU) & 1;
    local_d4 = 1;
  }
  SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)local_88);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(nullptr, &upcoming_detached_comments_,
                             &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);
    root_location.RecordLegacyLocation(file,
                                       DescriptorPool::ErrorCollector::OTHER);

    if (require_syntax_identifier_ || LookingAt("syntax") ||
        LookingAt("edition")) {
      if (!ParseSyntaxIdentifier(file, root_location)) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
      // Store the syntax into the file.
      if (file != nullptr) {
        file->set_syntax(syntax_identifier_);
        if (syntax_identifier_ == "editions") {
          file->set_edition(edition_);
        }
      }
    } else if (!stop_after_syntax_identifier_) {
      ABSL_LOG(WARNING) << "No syntax specified for the proto file: "
                        << file->name()
                        << ". Please use 'syntax = \"proto2\";' "
                        << "or 'syntax = \"proto3\";' to specify a syntax "
                        << "version. (Defaulted to proto2 syntax.)";
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          RecordError("Unmatched \"}\".");
          input_->NextWithComments(nullptr, &upcoming_detached_comments_,
                                   &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = nullptr;
  source_code_info_ = nullptr;
  assert(file != nullptr);
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}